

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator==
               (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
                *c1,Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
                    *c2)

{
  node_ptr plVar1;
  node_ptr plVar2;
  
  if (c1 == c2) {
    return true;
  }
  plVar2 = (c1->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  for (plVar1 = (c2->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
      (plVar2 != (node_ptr)&c1->column_ && (plVar1 != (node_ptr)&c2->column_));
      plVar1 = plVar1->next_) {
    if (*(int *)&plVar2[1].next_ != *(int *)&plVar1[1].next_) {
      return false;
    }
    plVar2 = plVar2->next_;
  }
  if (plVar2 != (node_ptr)&c1->column_) {
    return false;
  }
  return plVar1 == (node_ptr)&c2->column_;
}

Assistant:

bool operator==(const Intrusive_list_column& c1, const Intrusive_list_column& c2) {
    if (&c1 == &c2) return true;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ == c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      if (c1.column_.size() != c2.column_.size()) return false;
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index() || it1->get_element() != it2->get_element()) return false;
        ++it1;
        ++it2;
      }
      return true;
    }
  }